

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v8::detail::
     handle_dynamic_spec<fmt::v8::detail::precision_checker,fmt::v8::basic_format_context<fmt::v8::appender,char>>
               (int *value,arg_ref<char> ref,basic_format_context<fmt::v8::appender,_char> *ctx)

{
  basic_string_view<char> name;
  int iVar1;
  basic_format_context<fmt::v8::appender,_char> *in_RSI;
  int *in_RDI;
  int in_stack_00000008;
  undefined8 in_stack_ffffffffffffff58;
  basic_format_context<fmt::v8::appender,_char> *in_stack_ffffffffffffff60;
  basic_format_context<fmt::v8::appender,_char> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff84;
  
  if (in_stack_00000008 != 0) {
    if (in_stack_00000008 == 1) {
      basic_format_context<fmt::v8::appender,_char>::arg
                (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      basic_format_context<fmt::v8::appender,_char>::error_handler(in_RSI);
      iVar1 = get_dynamic_spec<fmt::v8::detail::precision_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>>,fmt::v8::detail::error_handler>
                        ();
      *in_RDI = iVar1;
    }
    else if (in_stack_00000008 == 2) {
      name.size_._0_4_ = 2;
      name.data_ = (char *)&stack0x00000008;
      name.size_._4_4_ = in_stack_ffffffffffffff84;
      basic_format_context<fmt::v8::appender,_char>::arg(in_stack_ffffffffffffff70,name);
      basic_format_context<fmt::v8::appender,_char>::error_handler(in_RSI);
      iVar1 = get_dynamic_spec<fmt::v8::detail::precision_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>>,fmt::v8::detail::error_handler>
                        ();
      *in_RDI = iVar1;
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_dynamic_spec(int& value,
                                       arg_ref<typename Context::char_type> ref,
                                       Context& ctx) {
  switch (ref.kind) {
  case arg_id_kind::none:
    break;
  case arg_id_kind::index:
    value = detail::get_dynamic_spec<Handler>(ctx.arg(ref.val.index),
                                              ctx.error_handler());
    break;
  case arg_id_kind::name:
    value = detail::get_dynamic_spec<Handler>(ctx.arg(ref.val.name),
                                              ctx.error_handler());
    break;
  }
}